

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long_const*>
          (Geometry<std::allocator<unsigned_long>> *this,unsigned_long *begin,unsigned_long *end,
          CoordinateOrder *externalCoordinateOrder,CoordinateOrder *internalCoordinateOrder,
          allocator_type *allocator)

{
  CoordinateOrder CVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  size_t *psVar4;
  ulong uVar5;
  size_t j;
  long lVar6;
  ulong j_00;
  
  uVar5 = (long)end - (long)begin >> 3;
  puVar3 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                     ((new_allocator<unsigned_long> *)this,uVar5 * 3,(void *)0x0);
  *(unsigned_long **)(this + 8) = puVar3;
  lVar6 = (long)end - (long)begin;
  *(long *)(this + 0x10) = (long)puVar3 + lVar6;
  *(long *)(this + 0x18) = lVar6 + (long)puVar3 + lVar6;
  *(ulong *)(this + 0x20) = uVar5;
  *(undefined8 *)(this + 0x28) = 1;
  CVar1 = *internalCoordinateOrder;
  *(CoordinateOrder *)(this + 0x30) = CVar1;
  this[0x34] = (Geometry<std::allocator<unsigned_long>>)0x1;
  if (lVar6 != 0) {
    this[0x34] = (Geometry<std::allocator<unsigned_long>>)(*externalCoordinateOrder == CVar1);
    for (j_00 = 0; j_00 < uVar5; j_00 = j_00 + 1) {
      sVar2 = begin[j_00];
      psVar4 = Geometry<std::allocator<unsigned_long>_>::shape
                         ((Geometry<std::allocator<unsigned_long>_> *)this,j_00);
      *psVar4 = sVar2;
      *(size_t *)(this + 0x28) = sVar2 * *(long *)(this + 0x28);
      uVar5 = *(ulong *)(this + 0x20);
    }
    stridesFromShape<unsigned_long*,unsigned_long*>
              (*(unsigned_long **)(this + 8),*(unsigned_long **)(this + 8) + uVar5,
               *(unsigned_long **)(this + 0x18),externalCoordinateOrder);
    stridesFromShape<unsigned_long*,unsigned_long*>
              (*(unsigned_long **)(this + 8),*(unsigned_long **)(this + 8) + *(long *)(this + 0x20),
               *(unsigned_long **)(this + 0x10),internalCoordinateOrder);
    return;
  }
  return;
}

Assistant:

inline 
Geometry<A>::Geometry
(
    ShapeIterator begin, 
    ShapeIterator end,
    const CoordinateOrder& externalCoordinateOrder,
    const CoordinateOrder& internalCoordinateOrder,
    const typename Geometry<A>::allocator_type& allocator
)
: allocator_(allocator),
  shape_(allocator_.allocate(std::distance(begin, end) * 3)), 
  shapeStrides_(shape_ + std::distance(begin, end)),
  strides_(shapeStrides_ + std::distance(begin, end)), 
  dimension_(std::distance(begin, end)),
  size_(1),
  coordinateOrder_(internalCoordinateOrder),
  isSimple_(true)
{
    if(dimension_ != 0) { // if the array is not a scalar
        isSimple_ = (externalCoordinateOrder == internalCoordinateOrder);
        for(std::size_t j=0; j<dimension(); ++j, ++begin) {
            const std::size_t s = static_cast<std::size_t>(*begin);
            shape(j) = s;
            size() *= s;
        }
        stridesFromShape(shapeBegin(), shapeEnd(), stridesBegin(), 
            externalCoordinateOrder);
        stridesFromShape(shapeBegin(), shapeEnd(), shapeStridesBegin(), 
            internalCoordinateOrder);
    }
}